

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelCreationUtils.cpp
# Opt level: O0

Pipeline *
buildEmptyPipelineModelWithStringOutput
          (Model *m,bool isUpdatable,TensorAttributes *inTensorAttr,char *outTensorName)

{
  undefined8 uVar1;
  ModelDescription *pMVar2;
  FeatureDescription *pFVar3;
  Arena *pAVar4;
  FeatureType *pFVar5;
  ArrayFeatureType *this;
  FeatureDescription *this_00;
  Pipeline *pPVar6;
  Pipeline *pipeline;
  FeatureDescription *outTensor;
  int i;
  ArrayFeatureType *inTensorShape;
  FeatureDescription *inTensor;
  char *outTensorName_local;
  TensorAttributes *inTensorAttr_local;
  Model *pMStack_30;
  bool isUpdatable_local;
  Model *m_local;
  FeatureDescription *local_20;
  FeatureDescription **local_18;
  FeatureDescription *local_10;
  
  inTensor = (FeatureDescription *)outTensorName;
  outTensorName_local = (char *)inTensorAttr;
  inTensorAttr_local._7_1_ = isUpdatable;
  pMStack_30 = m;
  pMVar2 = CoreML::Specification::Model::mutable_description(m);
  pFVar3 = CoreML::Specification::ModelDescription::add_input(pMVar2);
  m_local = (Model *)outTensorName_local;
  uVar1 = *(undefined8 *)outTensorName_local;
  local_20 = pFVar3;
  pAVar4 = google::protobuf::MessageLite::GetArenaForAllocation(&pFVar3->super_MessageLite);
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pFVar3->name_,uVar1,pAVar4);
  pFVar5 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  this = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar5);
  CoreML::Specification::ArrayFeatureType::set_datatype(this,ArrayFeatureType_ArrayDataType_FLOAT32)
  ;
  for (outTensor._4_4_ = 0; outTensor._4_4_ < *(int *)(outTensorName_local + 8);
      outTensor._4_4_ = outTensor._4_4_ + 1) {
    CoreML::Specification::ArrayFeatureType::add_shape(this,1);
  }
  pMVar2 = CoreML::Specification::Model::mutable_description(pMStack_30);
  this_00 = CoreML::Specification::ModelDescription::add_output(pMVar2);
  pFVar3 = inTensor;
  local_18 = &inTensor;
  local_10 = this_00;
  pAVar4 = google::protobuf::MessageLite::GetArenaForAllocation(&this_00->super_MessageLite);
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&this_00->name_,pFVar3,pAVar4);
  pFVar5 = CoreML::Specification::FeatureDescription::mutable_type(this_00);
  CoreML::Specification::FeatureType::mutable_stringtype(pFVar5);
  CoreML::Specification::Model::set_specificationversion(pMStack_30,4);
  pPVar6 = CoreML::Specification::Model::mutable_pipeline(pMStack_30);
  if ((inTensorAttr_local._7_1_ & 1) != 0) {
    CoreML::Specification::Model::set_isupdatable(pMStack_30,true);
  }
  return pPVar6;
}

Assistant:

Specification::Pipeline* buildEmptyPipelineModelWithStringOutput(Specification::Model& m, bool isUpdatable, const TensorAttributes *inTensorAttr, const char *outTensorName) {
    auto inTensor = m.mutable_description()->add_input();
    inTensor->set_name(inTensorAttr->name);
    auto inTensorShape = inTensor->mutable_type()->mutable_multiarraytype();
    inTensorShape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_FLOAT32);
    for (int i = 0; i < inTensorAttr->dimension; i++) {
        inTensorShape->add_shape(1);
    }
    
    auto outTensor = m.mutable_description()->add_output();
    outTensor->set_name(outTensorName);
    outTensor->mutable_type()->mutable_stringtype();
    
    m.set_specificationversion(MLMODEL_SPECIFICATION_VERSION_IOS13);
    
    auto pipeline = m.mutable_pipeline();
    
    if (isUpdatable) {
        m.set_isupdatable(true);
    }
    
    return pipeline;
}